

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_glsl.cpp
# Opt level: O0

void __thiscall
spirv_cross::CompilerGLSL::emit_spv_amd_shader_ballot_op
          (CompilerGLSL *this,uint32_t result_type,uint32_t id,uint32_t eop,uint32_t *args,
          uint32_t param_5)

{
  AMDShaderBallot op;
  allocator local_51;
  string local_50 [36];
  uint32_t local_2c;
  uint32_t *puStack_28;
  uint32_t param_6_local;
  uint32_t *args_local;
  uint32_t local_18;
  uint32_t eop_local;
  uint32_t id_local;
  uint32_t result_type_local;
  CompilerGLSL *this_local;
  
  local_2c = param_5;
  puStack_28 = args;
  args_local._4_4_ = eop;
  local_18 = id;
  eop_local = result_type;
  _id_local = this;
  ::std::allocator<char>::allocator();
  ::std::__cxx11::string::string(local_50,"GL_AMD_shader_ballot",&local_51);
  require_extension_internal(this,(string *)local_50);
  ::std::__cxx11::string::~string(local_50);
  ::std::allocator<char>::~allocator((allocator<char> *)&local_51);
  switch(args_local._4_4_) {
  case 1:
    emit_binary_func_op(this,eop_local,local_18,*puStack_28,puStack_28[1],"swizzleInvocationsAMD");
    register_control_dependent_expression(this,local_18);
    break;
  case 2:
    emit_binary_func_op(this,eop_local,local_18,*puStack_28,puStack_28[1],
                        "swizzleInvocationsMaskedAMD");
    register_control_dependent_expression(this,local_18);
    break;
  case 3:
    emit_trinary_func_op
              (this,eop_local,local_18,*puStack_28,puStack_28[1],puStack_28[2],"writeInvocationAMD")
    ;
    register_control_dependent_expression(this,local_18);
    break;
  case 4:
    emit_unary_func_op(this,eop_local,local_18,*puStack_28,"mbcntAMD");
    register_control_dependent_expression(this,local_18);
    break;
  default:
    statement<char_const(&)[43],unsigned_int&>
              (this,(char (*) [43])"// unimplemented SPV AMD shader ballot op ",
               (uint *)((long)&args_local + 4));
  }
  return;
}

Assistant:

void CompilerGLSL::emit_spv_amd_shader_ballot_op(uint32_t result_type, uint32_t id, uint32_t eop, const uint32_t *args,
                                                 uint32_t)
{
	require_extension_internal("GL_AMD_shader_ballot");

	enum AMDShaderBallot
	{
		SwizzleInvocationsAMD = 1,
		SwizzleInvocationsMaskedAMD = 2,
		WriteInvocationAMD = 3,
		MbcntAMD = 4
	};

	auto op = static_cast<AMDShaderBallot>(eop);

	switch (op)
	{
	case SwizzleInvocationsAMD:
		emit_binary_func_op(result_type, id, args[0], args[1], "swizzleInvocationsAMD");
		register_control_dependent_expression(id);
		break;

	case SwizzleInvocationsMaskedAMD:
		emit_binary_func_op(result_type, id, args[0], args[1], "swizzleInvocationsMaskedAMD");
		register_control_dependent_expression(id);
		break;

	case WriteInvocationAMD:
		emit_trinary_func_op(result_type, id, args[0], args[1], args[2], "writeInvocationAMD");
		register_control_dependent_expression(id);
		break;

	case MbcntAMD:
		emit_unary_func_op(result_type, id, args[0], "mbcntAMD");
		register_control_dependent_expression(id);
		break;

	default:
		statement("// unimplemented SPV AMD shader ballot op ", eop);
		break;
	}
}